

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>>&>
               (char **begin,char *end,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
               *eh)

{
  uint uVar1;
  long in_RSI;
  long *in_RDI;
  uint big;
  uint max_int;
  uint value;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 local_24;
  undefined4 local_4;
  
  if (*(char *)*in_RDI == '0') {
    *in_RDI = *in_RDI + 1;
    local_4 = 0;
  }
  else {
    local_24 = 0;
    uVar1 = std::numeric_limits<int>::max();
    do {
      if (uVar1 / 10 < local_24) {
        local_24 = uVar1 + 1;
        uVar2 = in_stack_ffffffffffffffd0;
        break;
      }
      local_24 = local_24 * 10 + *(char *)*in_RDI + -0x30;
      *in_RDI = *in_RDI + 1;
      uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
      if ((*in_RDI != in_RSI) &&
         (uVar2 = in_stack_ffffffffffffffd0 & 0xffffff, '/' < *(char *)*in_RDI)) {
        uVar2 = CONCAT13(*(char *)*in_RDI < ':',(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar2;
    } while ((char)(uVar2 >> 0x18) != '\0');
    if (uVar1 < local_24) {
      specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
      ::on_error((specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                  *)CONCAT44(uVar1 / 10,uVar2),in_stack_ffffffffffffffc8);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}